

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeparationVP.cpp
# Opt level: O2

bool __thiscall DIS::SeparationVP::operator==(SeparationVP *this,SeparationVP *rhs)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  unkbyte9 Var11;
  unkbyte10 Var12;
  undefined1 auVar13 [11];
  undefined1 auVar14 [12];
  undefined1 auVar15 [13];
  undefined1 auVar16 [14];
  undefined1 auVar17 [12];
  bool bVar18;
  int iVar19;
  EntityID *rhs_00;
  undefined1 auVar20 [16];
  undefined1 auVar27 [16];
  char cVar32;
  char cVar33;
  char cVar34;
  byte bVar35;
  undefined1 auVar28 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar29 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar30 [16];
  undefined1 auVar26 [16];
  undefined1 auVar25 [16];
  undefined2 uVar31;
  
  uVar1 = this->_recordType;
  uVar3 = this->_reasonForSeparation;
  uVar5 = this->_preEntityIndicator;
  uVar7 = this->_padding1;
  uVar9 = *(undefined4 *)&this->field_0xc;
  uVar2 = rhs->_recordType;
  uVar4 = rhs->_reasonForSeparation;
  uVar6 = rhs->_preEntityIndicator;
  uVar8 = rhs->_padding1;
  uVar10 = *(undefined4 *)&rhs->field_0xc;
  cVar32 = -((char)uVar10 == (char)uVar9);
  cVar33 = -((char)((uint)uVar10 >> 8) == (char)((uint)uVar9 >> 8));
  cVar34 = -((char)((uint)uVar10 >> 0x10) == (char)((uint)uVar9 >> 0x10));
  bVar35 = -((char)((uint)uVar10 >> 0x18) == (char)((uint)uVar9 >> 0x18));
  rhs_00 = &rhs->_parentEntityID;
  bVar18 = EntityID::operator==(&this->_parentEntityID,rhs_00);
  Var11 = CONCAT18(0xff,(ulong)bVar35 << 0x38);
  Var12 = CONCAT19(0xff,Var11);
  auVar13[10] = 0xff;
  auVar13._0_10_ = Var12;
  auVar14[0xb] = 0xff;
  auVar14._0_11_ = auVar13;
  auVar15[0xc] = 0xff;
  auVar15._0_12_ = auVar14;
  auVar26[0xd] = 0xff;
  auVar26._0_13_ = auVar15;
  auVar26[0xe] = bVar35;
  auVar26[0xf] = bVar35;
  auVar25._14_2_ = auVar26._14_2_;
  auVar25[0xd] = cVar34;
  auVar25._0_13_ = auVar15;
  auVar24._13_3_ = auVar25._13_3_;
  auVar24[0xc] = cVar34;
  auVar24._0_12_ = auVar14;
  auVar23._12_4_ = auVar24._12_4_;
  auVar23[0xb] = cVar33;
  auVar23._0_11_ = auVar13;
  auVar22._11_5_ = auVar23._11_5_;
  auVar22[10] = cVar33;
  auVar22._0_10_ = Var12;
  auVar21._10_6_ = auVar22._10_6_;
  auVar21[9] = cVar32;
  auVar21._0_9_ = Var11;
  Var12 = CONCAT91(CONCAT81((long)(CONCAT72(auVar21._9_7_,CONCAT11(cVar32,bVar35)) >> 8),
                            -(uVar8 == uVar7)),-(uVar8 == uVar7));
  auVar17._2_10_ = Var12;
  auVar17[1] = -(uVar6 == uVar5);
  auVar17[0] = -(uVar6 == uVar5);
  auVar16._2_12_ = auVar17;
  auVar16[1] = -(uVar4 == uVar3);
  auVar16[0] = -(uVar4 == uVar3);
  auVar20._0_2_ = CONCAT11(-(uVar2 == uVar1),-(uVar2 == uVar1));
  auVar20._2_14_ = auVar16;
  uVar31 = (undefined2)Var12;
  auVar30._0_12_ = auVar20._0_12_;
  auVar30._12_2_ = uVar31;
  auVar30._14_2_ = uVar31;
  auVar29._12_4_ = auVar30._12_4_;
  auVar29._0_10_ = auVar20._0_10_;
  auVar29._10_2_ = auVar17._0_2_;
  auVar28._10_6_ = auVar29._10_6_;
  auVar28._0_8_ = auVar20._0_8_;
  auVar28._8_2_ = auVar17._0_2_;
  auVar27._8_8_ = auVar28._8_8_;
  auVar27._6_2_ = auVar16._0_2_;
  auVar27._4_2_ = auVar16._0_2_;
  auVar27._2_2_ = auVar20._0_2_;
  auVar27._0_2_ = auVar20._0_2_;
  iVar19 = movmskps((int)rhs_00,auVar27);
  return (bVar18 && this->_padding2 == rhs->_padding2) &&
         (iVar19 == 0xf && rhs->_stationLocation == this->_stationLocation);
}

Assistant:

bool SeparationVP::operator ==(const SeparationVP& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_recordType == rhs._recordType) ) ivarsEqual = false;
     if( ! (_reasonForSeparation == rhs._reasonForSeparation) ) ivarsEqual = false;
     if( ! (_preEntityIndicator == rhs._preEntityIndicator) ) ivarsEqual = false;
     if( ! (_padding1 == rhs._padding1) ) ivarsEqual = false;
     if( ! (_parentEntityID == rhs._parentEntityID) ) ivarsEqual = false;
     if( ! (_padding2 == rhs._padding2) ) ivarsEqual = false;
     if( ! (_stationLocation == rhs._stationLocation) ) ivarsEqual = false;

    return ivarsEqual;
 }